

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O0

void __thiscall
despot::SimpleRockSample::PrintAction(SimpleRockSample *this,ACT_TYPE action,ostream *out)

{
  ostream *poVar1;
  ostream *out_local;
  ACT_TYPE action_local;
  SimpleRockSample *this_local;
  
  if (action == 0) {
    poVar1 = std::operator<<(out,"Sample");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (action == 3) {
    poVar1 = std::operator<<(out,"Check");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (action == 1) {
    poVar1 = std::operator<<(out,"EAST ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (action == 2) {
    poVar1 = std::operator<<(out,"West");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void SimpleRockSample::PrintAction(ACT_TYPE action, ostream& out) const {
	if (action == A_SAMPLE)
		out << "Sample" << endl;
	if (action == A_CHECK)
		out << "Check" << endl;
	if (action == A_EAST)
		out << "EAST " << endl;
	if (action == A_WEST)
		out << "West" << endl;
}